

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O1

string * __thiscall
vkt::geometry::(anonymous_namespace)::GeometryExpanderRenderTest::shaderGeometry_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool pointSize)

{
  ostream *poVar1;
  VkPrimitiveTopology *inputType;
  VkPrimitiveTopology *outputType;
  ostringstream src;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  if (pointSize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"#extension GL_EXT_geometry_point_size : require\n",0x30);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"layout(",7);
  inputTypeToGLString_abi_cxx11_(&local_1c0,(geometry *)((long)this + 0x70),inputType);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"layout(",7);
  outputTypeToGLString_abi_cxx11_(&local_1e0,(geometry *)((long)this + 0x74),outputType);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", max_vertices = ",0x11);
  calcOutputVertices((VkPrimitiveTopology *)((long)this + 0x70));
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(location = 0) out highp vec4 v_frag_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\thighp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n",
             0x4b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tfor (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t{\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (pointSize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\t\tgl_PointSize = 1.0;\n",0x16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tgl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tEmitVertex();\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (pointSize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\t\tgl_PointSize = 1.0;\n",0x16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tgl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tEmitVertex();\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (pointSize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\t\tgl_PointSize = 1.0;\n",0x16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tgl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tEmitVertex();\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\t\tEndPrimitive();\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string GeometryExpanderRenderTest::shaderGeometry (bool pointSize) const
{
	std::ostringstream src;
	src	<< "#version 310 es\n"
		<< "#extension GL_EXT_geometry_shader : require\n";
	if (pointSize)
		src	<<"#extension GL_EXT_geometry_point_size : require\n";
	src	<< "layout(" << inputTypeToGLString(m_primitiveType) << ") in;\n"
		<< "layout(" << outputTypeToGLString(m_outputType) << ", max_vertices = " << calcOutputVertices(m_primitiveType) << ") out;\n"
		<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
		<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	const highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n"
		<< "	const highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n"
		<< "	const highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n"
		<< "	highp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n"
		<< "\n"
		<< "	for (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n"
		<< "	{\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "		EndPrimitive();\n"
		<< "	}\n"
		<< "}\n";
	return src.str();
}